

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlm_global_quantum.cpp
# Opt level: O2

sc_time __thiscall tlm::tlm_global_quantum::compute_local_quantum(tlm_global_quantum *this)

{
  sc_time tmp;
  sc_time *psVar1;
  ulong uVar2;
  ulong *in_RSI;
  
  uVar2 = *in_RSI;
  if (uVar2 != sc_core::SC_ZERO_TIME) {
    psVar1 = sc_core::sc_time_stamp();
    uVar2 = *in_RSI - psVar1->m_value % *in_RSI;
  }
  (this->m_global_quantum).m_value = uVar2;
  return (sc_time)(value_type)this;
}

Assistant:

sc_core::sc_time
tlm_global_quantum::compute_local_quantum()
{
  if (m_global_quantum != sc_core::SC_ZERO_TIME) {
    const sc_core::sc_time current = sc_core::sc_time_stamp();
    const sc_core::sc_time g_quant = m_global_quantum;
    return g_quant - (current % g_quant);
  } else {
    return sc_core::SC_ZERO_TIME;
  }
}